

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  Enum EVar1;
  char cVar2;
  uint32_t prefix_code;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  Offset OVar5;
  uint32_t value;
  uint8_t buffer [5];
  undefined2 uStack_18;
  undefined1 local_16;
  undefined5 local_15;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (ulong)this->enum_;
  if (uVar4 < 0x21c) {
    cVar2 = infos_[uVar4 * 0x48 + 0x38];
    if (cVar2 != '\0') {
LAB_0012c427:
      local_15 = (undefined5)((ulong)in_RAX >> 0x18);
      uStack_18 = (undefined2)in_RAX;
      _uStack_18 = CONCAT12(cVar2,uStack_18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_16);
      EVar1 = this->enum_;
      if ((ulong)EVar1 < 0x21c) {
        value = *(uint32_t *)(infos_ + (ulong)EVar1 * 0x48 + 0x3c);
      }
      else {
        value = -EVar1 & 0xff;
      }
      OVar5 = WriteU32Leb128Raw((uint8_t *)&local_15,&stack0xfffffffffffffff0,value);
      if (OVar5 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,&local_15,(long)&local_15 + OVar5);
        return __return_storage_ptr__;
      }
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/opcode.cc"
                    ,0x1a5,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    uVar3 = *(uint *)(infos_ + uVar4 * 0x48 + 0x3c);
  }
  else {
    uVar3 = -this->enum_;
    if ((uVar3 & 0x1fe00) != 0) {
      cVar2 = (char)(uVar3 >> 9);
      goto LAB_0012c427;
    }
  }
  _local_16 = (undefined6)((ulong)in_RAX >> 0x10);
  uStack_18 = CONCAT11((char)uVar3,(char)in_RAX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__return_storage_ptr__,(uchar *)((long)&uStack_18 + 1));
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}